

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
* __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::
CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize(google::protobuf::io::Printer*)::__0>
          (vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,Options *options,anon_class_8_1_8991fb9c *equivalent)

{
  bool bVar1;
  byte bVar2;
  reference ppFVar3;
  reference pvVar4;
  reference ppFVar5;
  bool local_5f;
  bool local_5e;
  bool local_5d [13];
  FieldDescriptor *local_50;
  FieldDescriptor *field;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  anon_class_8_1_8991fb9c *equivalent_local;
  Options *options_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  *chunks;
  
  std::
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  ::vector(__return_storage_ptr__);
  __end4 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)this);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end4);
    local_50 = *ppFVar3;
    bVar1 = std::
            vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
            ::empty(__return_storage_ptr__);
    if (bVar1) {
LAB_002dd2ef:
      bVar2 = google::protobuf::internal::cpp::HasHasbit(local_50);
      local_5d[0] = (bool)(bVar2 & 1);
      local_5e = IsRarelyPresent(local_50,(Options *)fields);
      local_5f = ShouldSplit(local_50,(Options *)fields);
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
      ::emplace_back<bool,bool,bool>
                ((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
                  *)__return_storage_ptr__,local_5d,&local_5e,&local_5f);
    }
    else {
      pvVar4 = std::
               vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
               ::back(__return_storage_ptr__);
      ppFVar5 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::back(&pvVar4->fields);
      bVar1 = MessageGenerator::GenerateByteSize::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)options,*ppFVar5,local_50);
      if (!bVar1) goto LAB_002dd2ef;
    }
    pvVar4 = std::
             vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
             ::back(__return_storage_ptr__);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(&pvVar4->fields,&local_50);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end4);
  } while( true );
}

Assistant:

std::vector<FieldChunk> CollectFields(
    const std::vector<const FieldDescriptor*>& fields, const Options& options,
    const Predicate& equivalent) {
  std::vector<FieldChunk> chunks;
  for (auto field : fields) {
    if (chunks.empty() || !equivalent(chunks.back().fields.back(), field)) {
      chunks.emplace_back(HasHasbit(field), IsRarelyPresent(field, options),
                          ShouldSplit(field, options));
    }
    chunks.back().fields.push_back(field);
  }
  return chunks;
}